

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O0

void test5(void)

{
  int j;
  int i;
  char *in_stack_00000010;
  int *in_stack_00000020;
  int *in_stack_00000028;
  _func_void_int_int *in_stack_00000030;
  int local_28;
  int local_24;
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::spawn<void(int,int),int,int&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_24 = 0; local_24 < nsize; local_24 = local_24 + 1) {
    if (mx[local_24][0] != 1) {
      doerror();
    }
    mx[local_24][0] = 0;
    for (local_28 = 1; local_28 < 8; local_28 = local_28 + 1) {
      if (mx[local_24][local_28] != 0) {
        doerror();
      }
    }
  }
  pr(in_stack_00000010);
  return;
}

Assistant:

void test5() 
{
  
  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(rec2, 0, nsize);
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != 1) doerror();
    mx[i][0] = 0;
    for (int j=1; j < 8; ++j)
      if(mx[i][j] != 0) doerror();
  }
  
  pr("f(frozen int) rec2");
  
}